

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inversespectrogram.cpp
# Opt level: O0

int __thiscall
ncnn::InverseSpectrogram::forward
          (InverseSpectrogram *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  long lVar2;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  __type _Var9;
  int i_6;
  int i_5;
  int output_index;
  double angle;
  int k_3;
  float im;
  float re;
  int i_4;
  int i_3;
  float norm_1;
  int i_2;
  float norm;
  int k_2;
  int k_1;
  int k;
  Mat sp;
  int j;
  Mat window_sumsquare;
  size_t elemsize;
  int outsize;
  int onesided;
  int freqs;
  int frames;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined4 in_stack_fffffffffffff238;
  undefined4 in_stack_fffffffffffff23c;
  size_t in_stack_fffffffffffff240;
  undefined8 in_stack_fffffffffffff248;
  int _w;
  Mat *in_stack_fffffffffffff250;
  int local_ae4;
  int local_ad4;
  int local_ad0;
  int local_acc;
  int local_ac0;
  float local_abc;
  float local_ab8;
  int local_ab4;
  int local_ab0;
  int local_aa8;
  undefined8 local_aa0;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined4 local_a88;
  long local_a80;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined8 local_a60;
  undefined8 local_a58;
  undefined8 local_a50;
  undefined8 local_a48;
  undefined4 local_a40;
  long local_a38;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined4 local_a20;
  undefined8 local_a18;
  int local_a0c;
  undefined8 local_a08;
  undefined8 local_a00;
  undefined8 local_9f8;
  undefined4 local_9f0;
  long local_9e8;
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined8 local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined4 local_9a8;
  long local_9a0;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined8 local_980;
  int local_974;
  undefined8 local_970;
  undefined8 local_968;
  undefined8 local_960;
  undefined4 local_958;
  long local_950;
  undefined4 local_948;
  undefined4 local_944;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined8 local_930;
  undefined8 local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined4 local_910;
  long local_908;
  undefined4 local_900;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined8 local_8e8;
  int local_8dc;
  void *local_8d8;
  int *local_8d0;
  long local_8c8;
  undefined4 local_8c0;
  long *local_8b8;
  undefined4 local_8b0;
  int local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined8 local_898;
  int local_88c;
  undefined4 local_888;
  undefined4 *local_878;
  int *local_870;
  undefined8 local_868;
  undefined4 local_860;
  long *local_858;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined4 local_844;
  int local_840;
  long local_838;
  long local_830;
  int local_828;
  uint local_824;
  int local_820;
  int local_81c;
  long local_818;
  long *local_810;
  long *local_808;
  int local_7f4;
  long local_7f0;
  long *local_7e8;
  long local_7e0;
  undefined4 **local_7d8;
  long local_7d0;
  undefined4 **local_7c8;
  long local_7c0;
  undefined4 **local_7b8;
  long local_7b0;
  undefined4 **local_7a8;
  long local_7a0;
  undefined4 **local_798;
  long local_790;
  long *local_788;
  long local_780;
  long *local_778;
  long local_770;
  undefined4 **local_768;
  long local_760;
  void **local_758;
  long local_750;
  void **local_748;
  undefined4 **local_740;
  long *local_738;
  undefined8 local_730;
  long local_728;
  int local_71c;
  undefined4 **local_718;
  int local_70c;
  undefined4 *local_708;
  int local_700;
  undefined4 local_6fc;
  undefined4 **local_6f8;
  int local_6ec;
  undefined4 *local_6e8;
  int local_6e0;
  undefined4 local_6dc;
  long *local_6d8;
  undefined8 local_6d0;
  undefined8 local_6c8;
  undefined4 local_6c0;
  undefined4 local_6bc;
  void **local_6b8;
  undefined1 local_6ad;
  int local_6ac;
  undefined8 *local_6a0;
  undefined1 local_695;
  int local_694;
  undefined8 *local_688;
  undefined1 local_67d;
  int local_67c;
  undefined8 *local_670;
  undefined1 local_665;
  int local_664;
  undefined8 *local_658;
  undefined1 local_64d;
  int local_64c;
  undefined8 *local_640;
  undefined1 local_635;
  int local_634;
  undefined8 *local_628;
  int local_61c;
  undefined8 *local_618;
  int local_60c;
  undefined8 *local_608;
  int local_5fc;
  undefined8 *local_5f8;
  int local_5ec;
  undefined8 *local_5e8;
  int local_5dc;
  undefined8 *local_5d8;
  int local_5cc;
  undefined8 *local_5c8;
  int local_5bc;
  long *local_5b8;
  int local_5ac;
  long *local_5a8;
  int local_59c;
  long *local_598;
  int local_58c;
  long *local_588;
  int local_57c;
  void **local_578;
  int local_56c;
  void **local_568;
  int local_55c;
  void **local_558;
  int local_54c;
  void **local_548;
  int local_53c;
  void **local_538;
  int local_52c;
  void **local_528;
  int local_51c;
  void **local_518;
  int local_50c;
  void **local_508;
  int local_4fc;
  void **local_4f8;
  int local_4ec;
  void **local_4e8;
  undefined8 *local_4b0;
  undefined8 *local_4a0;
  undefined8 *local_490;
  undefined8 *local_480;
  undefined8 *local_470;
  undefined8 *local_460;
  void **local_450;
  undefined4 **local_440;
  long local_430;
  long *local_428;
  long local_420;
  long *local_418;
  long local_410;
  long *local_408;
  long local_400;
  long *local_3f8;
  long local_3f0;
  long *local_3e8;
  long *local_3e0;
  undefined4 **local_3d8;
  long *local_3d0;
  undefined4 **local_3c8;
  long local_3c0;
  undefined4 local_3b4;
  long local_3b0;
  long local_3a8;
  undefined4 local_39c;
  int local_398;
  int local_394;
  undefined8 *local_390;
  long local_388;
  undefined4 local_37c;
  long local_378;
  long local_370;
  undefined4 local_364;
  int local_360;
  int local_35c;
  undefined8 *local_358;
  long local_350;
  undefined4 local_344;
  long local_340;
  long local_338;
  undefined4 local_32c;
  int local_328;
  int local_324;
  undefined8 *local_320;
  long local_318;
  undefined4 local_30c;
  long local_308;
  long local_300;
  undefined4 local_2f4;
  int local_2f0;
  int local_2ec;
  undefined8 *local_2e8;
  long local_2e0;
  undefined4 local_2d4;
  long local_2d0;
  long local_2c8;
  undefined4 local_2bc;
  int local_2b8;
  int local_2b4;
  undefined8 *local_2b0;
  long local_2a8;
  undefined4 local_29c;
  long local_298;
  long local_290;
  undefined4 local_284;
  int local_280;
  int local_27c;
  undefined8 *local_278;
  undefined4 local_26c;
  long local_268;
  undefined4 local_25c;
  long local_258;
  undefined4 local_24c;
  long local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  int local_200;
  undefined4 local_1fc;
  undefined4 **local_1f8;
  int local_1e0;
  undefined4 local_1dc;
  void **local_1d8;
  undefined8 *local_1b8;
  undefined8 *local_198;
  undefined8 *local_178;
  undefined8 *local_158;
  undefined8 *local_138;
  undefined8 *local_118;
  void *local_20;
  undefined4 *local_10;
  
  local_81c = (int)in_RSI[6];
  local_820 = (int)in_RSI[7];
  local_824 = (uint)(local_820 == *(int *)(in_RDI + 0xd0) / 2 + 1);
  if (*(int *)(in_RDI + 0xe4) == 0) {
    local_ae4 = (local_81c + -1) * *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xd0);
  }
  else {
    local_ae4 = (local_81c + -1) * *(int *)(in_RDI + 0xd8) +
                *(int *)(in_RDI + 0xd0) + (*(int *)(in_RDI + 0xd0) / 2) * -2;
  }
  local_828 = local_ae4;
  local_830 = in_RSI[2];
  _w = (int)((ulong)in_stack_fffffffffffff248 >> 0x20);
  local_818 = in_RCX;
  local_810 = in_RDX;
  local_808 = in_RSI;
  if (*(int *)(in_RDI + 0xd4) == 0) {
    Mat::create(in_stack_fffffffffffff250,_w,(int)in_stack_fffffffffffff248,
                in_stack_fffffffffffff240,
                (Allocator *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
  }
  else {
    Mat::create(in_stack_fffffffffffff250,_w,in_stack_fffffffffffff240,
                (Allocator *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
  }
  local_738 = local_810;
  bVar3 = true;
  if (*local_810 != 0) {
    local_3d0 = local_810;
    bVar3 = local_810[8] * (long)(int)local_810[7] == 0;
  }
  if (bVar3) {
    local_7f4 = -100;
  }
  else {
    local_71c = local_828 + *(int *)(in_RDI + 0xd0);
    local_730 = *(undefined8 *)(local_818 + 0x10);
    local_718 = &local_878;
    local_728 = local_830;
    local_878 = (undefined4 *)0x0;
    local_870 = (int *)0x0;
    local_868 = 0;
    local_860 = 0;
    local_858 = (long *)0x0;
    local_850 = 0;
    local_84c = 0;
    local_848 = 0;
    local_844 = 0;
    local_840 = 0;
    local_838 = 0;
    Mat::create(in_stack_fffffffffffff250,(int)((ulong)in_stack_fffffffffffff248 >> 0x20),
                in_stack_fffffffffffff240,
                (Allocator *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
    local_740 = &local_878;
    if (local_878 != (undefined4 *)0x0) {
      local_3c8 = local_740;
    }
    if (local_878 != (undefined4 *)0x0 && local_838 * local_840 != 0) {
      local_6d8 = local_810;
      local_6dc = 0;
      local_3e0 = local_810;
      local_6e0 = (int)local_810[8] * (int)local_810[7];
      local_6e8 = (undefined4 *)*local_810;
      for (local_6ec = 0; local_6ec < local_6e0; local_6ec = local_6ec + 1) {
        *local_6e8 = 0;
        local_6e8 = local_6e8 + 1;
      }
      local_6f8 = &local_878;
      local_6fc = 0;
      local_700 = (int)local_838 * local_840;
      local_708 = local_878;
      for (local_70c = 0; local_70c < local_700; local_70c = local_70c + 1) {
        *local_708 = 0;
        local_708 = local_708 + 1;
      }
      local_3d8 = local_6f8;
      for (local_88c = 0; local_88c < local_81c; local_88c = local_88c + 1) {
        local_6c0 = *(undefined4 *)(in_RDI + 0xd0);
        local_6b8 = &local_8d8;
        local_6bc = 2;
        local_6c8 = 4;
        local_6d0 = 0;
        local_8d8 = (void *)0x0;
        local_8d0 = (int *)0x0;
        local_8c8 = 0;
        local_8c0 = 0;
        local_8b8 = (long *)0x0;
        local_8b0 = 0;
        local_8ac = 0;
        local_8a8 = 0;
        local_8a4 = 0;
        local_8a0 = 0;
        local_898 = 0;
        Mat::create(in_stack_fffffffffffff250,(int)((ulong)in_stack_fffffffffffff248 >> 0x20),
                    (int)in_stack_fffffffffffff248,in_stack_fffffffffffff240,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
        if (local_824 == 1) {
          for (local_8dc = 0; local_8dc < *(int *)(in_RDI + 0xd0) / 2 + 1; local_8dc = local_8dc + 1
              ) {
            local_628 = &local_928;
            local_394 = *(int *)((long)local_808 + 0x2c);
            local_398 = (int)local_808[6];
            local_39c = *(undefined4 *)((long)local_808 + 0x34);
            local_3a8 = *local_808 + local_808[8] * (long)local_8dc * local_808[2];
            local_3b0 = local_808[2];
            local_3b4 = (undefined4)local_808[3];
            local_3c0 = local_808[4];
            local_390 = &local_928;
            local_218 = (long)local_394 * (long)local_398 * local_3b0;
            local_5c8 = &local_928;
            local_4e8 = &local_8d8;
            *(undefined4 *)((long)local_8d8 + (long)local_8ac * (long)local_8dc * local_8c8) =
                 *(undefined4 *)(local_3a8 + (long)local_394 * (long)local_88c * local_3b0);
            local_4b0 = &local_928;
            local_640 = &local_970;
            local_35c = *(int *)((long)local_808 + 0x2c);
            local_360 = (int)local_808[6];
            local_364 = *(undefined4 *)((long)local_808 + 0x34);
            local_370 = *local_808 + local_808[8] * (long)local_8dc * local_808[2];
            local_378 = local_808[2];
            local_37c = (undefined4)local_808[3];
            local_388 = local_808[4];
            local_358 = &local_970;
            local_228 = (long)local_35c * (long)local_360 * local_378;
            local_8f0 = 0;
            local_8f4 = 0;
            local_8f8 = 0;
            local_8fc = 0;
            local_910 = 0;
            local_918 = 0;
            local_920 = 0;
            local_928 = 0;
            local_21c = 0x10;
            local_22c = 0x10;
            local_4ec = local_8dc;
            local_5cc = local_88c;
            local_634 = local_8dc;
            local_635 = 1;
            local_64c = local_8dc;
            local_64d = 1;
            local_8e8 = 0;
            local_900 = 0;
            local_5d8 = &local_970;
            local_5dc = local_88c;
            local_4f8 = &local_8d8;
            local_4fc = local_8dc;
            *(undefined4 *)((long)local_8d8 + (long)local_8ac * (long)local_8dc * local_8c8 + 4) =
                 *(undefined4 *)(local_370 + (long)local_35c * (long)local_88c * local_378 + 4);
            local_4a0 = &local_970;
            local_970 = 0;
            local_960 = 0;
            local_958 = 0;
            local_948 = 0;
            local_944 = 0;
            local_940 = 0;
            local_93c = 0;
            local_938 = 0;
            local_930 = 0;
            local_968 = 0;
            local_138 = local_4a0;
            local_118 = local_4b0;
            local_950 = local_388;
            local_908 = local_3c0;
          }
          local_974 = *(int *)(in_RDI + 0xd0) / 2;
          while (local_974 = local_974 + 1, local_974 < *(int *)(in_RDI + 0xd0)) {
            local_664 = *(int *)(in_RDI + 0xd0) - local_974;
            local_658 = &local_9c0;
            local_324 = *(int *)((long)local_808 + 0x2c);
            local_328 = (int)local_808[6];
            local_32c = *(undefined4 *)((long)local_808 + 0x34);
            local_338 = *local_808 + local_808[8] * (long)local_664 * local_808[2];
            local_340 = local_808[2];
            local_344 = (undefined4)local_808[3];
            local_350 = local_808[4];
            local_320 = &local_9c0;
            local_238 = (long)local_324 * (long)local_328 * local_340;
            local_23c = 0x10;
            local_665 = 1;
            local_5e8 = &local_9c0;
            local_5ec = local_88c;
            local_508 = &local_8d8;
            local_50c = local_974;
            *(undefined4 *)((long)local_8d8 + (long)local_8ac * (long)local_974 * local_8c8) =
                 *(undefined4 *)(local_338 + (long)local_324 * (long)local_88c * local_340);
            local_490 = &local_9c0;
            local_9c0 = 0;
            local_9b0 = 0;
            local_9a8 = 0;
            local_994 = 0;
            local_990 = 0;
            local_98c = 0;
            local_988 = 0;
            local_9b8 = 0;
            local_67c = *(int *)(in_RDI + 0xd0) - local_974;
            local_670 = &local_a08;
            local_2ec = *(int *)((long)local_808 + 0x2c);
            local_2f0 = (int)local_808[6];
            local_2f4 = *(undefined4 *)((long)local_808 + 0x34);
            local_300 = *local_808 + local_808[8] * (long)local_67c * local_808[2];
            local_308 = local_808[2];
            local_30c = (undefined4)local_808[3];
            local_318 = local_808[4];
            local_2e8 = &local_a08;
            local_248 = (long)local_2ec * (long)local_2f0 * local_308;
            local_24c = 0x10;
            local_67d = 1;
            local_980 = 0;
            local_998 = 0;
            local_5f8 = &local_a08;
            local_5fc = local_88c;
            local_518 = &local_8d8;
            local_51c = local_974;
            *(uint *)((long)local_8d8 + (long)local_8ac * (long)local_974 * local_8c8 + 4) =
                 *(uint *)(local_300 + (long)local_2ec * (long)local_88c * local_308 + 4) ^
                 0x80000000;
            local_480 = &local_a08;
            local_a08 = 0;
            local_9f8 = 0;
            local_9f0 = 0;
            local_9e0 = 0;
            local_9dc = 0;
            local_9d8 = 0;
            local_9d4 = 0;
            local_9d0 = 0;
            local_9c8 = 0;
            local_a00 = 0;
            local_178 = local_480;
            local_158 = local_490;
            local_9e8 = local_318;
            local_9a0 = local_350;
          }
        }
        else {
          for (local_a0c = 0; local_a0c < *(int *)(in_RDI + 0xd0); local_a0c = local_a0c + 1) {
            local_688 = &local_a58;
            local_2b4 = *(int *)((long)local_808 + 0x2c);
            local_2b8 = (int)local_808[6];
            local_2bc = *(undefined4 *)((long)local_808 + 0x34);
            local_2c8 = *local_808 + local_808[8] * (long)local_a0c * local_808[2];
            local_2d0 = local_808[2];
            local_2d4 = (undefined4)local_808[3];
            local_2e0 = local_808[4];
            local_2b0 = &local_a58;
            local_258 = (long)local_2b4 * (long)local_2b8 * local_2d0;
            local_608 = &local_a58;
            local_528 = &local_8d8;
            *(undefined4 *)((long)local_8d8 + (long)local_8ac * (long)local_a0c * local_8c8) =
                 *(undefined4 *)(local_2c8 + (long)local_2b4 * (long)local_88c * local_2d0);
            local_470 = &local_a58;
            local_25c = 0x10;
            local_52c = local_a0c;
            local_60c = local_88c;
            local_694 = local_a0c;
            local_695 = 1;
            local_a58 = 0;
            local_a48 = 0;
            local_a40 = 0;
            local_a2c = 0;
            local_a28 = 0;
            local_a24 = 0;
            local_a20 = 0;
            local_a50 = 0;
            local_6a0 = &local_aa0;
            local_27c = *(int *)((long)local_808 + 0x2c);
            local_280 = (int)local_808[6];
            local_284 = *(undefined4 *)((long)local_808 + 0x34);
            local_290 = *local_808 + local_808[8] * (long)local_a0c * local_808[2];
            local_298 = local_808[2];
            local_29c = (undefined4)local_808[3];
            local_2a8 = local_808[4];
            local_278 = &local_aa0;
            local_268 = (long)local_27c * (long)local_280 * local_298;
            local_26c = 0x10;
            local_6ac = local_a0c;
            local_6ad = 1;
            local_a18 = 0;
            local_a30 = 0;
            local_618 = &local_aa0;
            local_61c = local_88c;
            local_538 = &local_8d8;
            local_53c = local_a0c;
            *(undefined4 *)((long)local_8d8 + (long)local_8ac * (long)local_a0c * local_8c8 + 4) =
                 *(undefined4 *)(local_290 + (long)local_27c * (long)local_88c * local_298 + 4);
            local_460 = &local_aa0;
            local_aa0 = 0;
            local_a90 = 0;
            local_a88 = 0;
            local_a78 = 0;
            local_a74 = 0;
            local_a70 = 0;
            local_a6c = 0;
            local_a68 = 0;
            local_a60 = 0;
            local_a98 = 0;
            local_1b8 = local_460;
            local_198 = local_470;
            local_a80 = local_2a8;
            local_a38 = local_2e0;
          }
        }
        if (*(int *)(in_RDI + 0xe8) == 1) {
          _Var9 = std::sqrt<int>(*(int *)(in_RDI + 0xd0));
          for (local_aa8 = 0;
              SBORROW4(local_aa8,*(int *)(in_RDI + 0xd0) * 2) !=
              local_aa8 + *(int *)(in_RDI + 0xd0) * -2 < 0; local_aa8 = local_aa8 + 1) {
            local_750 = (long)local_aa8;
            local_748 = &local_8d8;
            pfVar1 = (float *)((long)local_8d8 + local_750 * 4);
            *pfVar1 = (float)_Var9 * *pfVar1;
          }
        }
        if (*(int *)(in_RDI + 0xe8) == 2) {
          local_3e8 = (long *)(in_RDI + 0xf0);
          local_3f0 = (long)*(int *)(in_RDI + 0xd0);
          fVar7 = *(float *)(*local_3e8 + local_3f0 * 4);
          for (local_ab0 = 0;
              SBORROW4(local_ab0,*(int *)(in_RDI + 0xd0) * 2) !=
              local_ab0 + *(int *)(in_RDI + 0xd0) * -2 < 0; local_ab0 = local_ab0 + 1) {
            local_760 = (long)local_ab0;
            local_758 = &local_8d8;
            pfVar1 = (float *)((long)local_8d8 + local_760 * 4);
            *pfVar1 = fVar7 * *pfVar1;
          }
        }
        for (local_ab4 = 0; local_ab4 < *(int *)(in_RDI + 0xd0); local_ab4 = local_ab4 + 1) {
          local_ab8 = 0.0;
          local_abc = 0.0;
          for (local_ac0 = 0; local_ac0 < *(int *)(in_RDI + 0xd0); local_ac0 = local_ac0 + 1) {
            fVar6 = ((float)local_ab4 * 6.2831855 * (float)local_ac0) /
                    (float)*(int *)(in_RDI + 0xd0);
            local_548 = &local_8d8;
            local_54c = local_ac0;
            fVar7 = *(float *)((long)local_8d8 + (long)local_8ac * (long)local_ac0 * local_8c8);
            fVar4 = cosf(fVar6);
            local_558 = &local_8d8;
            local_55c = local_ac0;
            fVar8 = *(float *)((long)local_8d8 + (long)local_8ac * (long)local_ac0 * local_8c8 + 4);
            fVar5 = sinf(fVar6);
            local_ab8 = (fVar7 * fVar4 - fVar8 * fVar5) + local_ab8;
            local_568 = &local_8d8;
            local_56c = local_ac0;
            fVar7 = *(float *)((long)local_8d8 + (long)local_8ac * (long)local_ac0 * local_8c8);
            fVar4 = sinf(fVar6);
            local_578 = &local_8d8;
            local_57c = local_ac0;
            fVar8 = *(float *)((long)local_8d8 + (long)local_8ac * (long)local_ac0 * local_8c8 + 4);
            fVar6 = cosf(fVar6);
            local_abc = fVar7 * fVar4 + fVar8 * fVar6 + local_abc;
          }
          local_3f8 = (long *)(in_RDI + 0xf0);
          local_400 = (long)local_ab4;
          fVar7 = *(float *)(*local_3f8 + local_400 * 4) *
                  (local_ab8 / (float)*(int *)(in_RDI + 0xd0));
          local_408 = (long *)(in_RDI + 0xf0);
          local_410 = (long)local_ab4;
          fVar8 = *(float *)(*local_408 + local_410 * 4) *
                  (local_abc / (float)*(int *)(in_RDI + 0xd0));
          local_acc = local_88c * *(int *)(in_RDI + 0xd8) + local_ab4;
          if (*(int *)(in_RDI + 0xe4) == 1) {
            local_acc = local_acc - *(int *)(in_RDI + 0xd0) / 2;
          }
          if ((-1 < local_acc) && (local_acc < local_828)) {
            local_418 = (long *)(in_RDI + 0xf0);
            local_420 = (long)local_ab4;
            local_428 = (long *)(in_RDI + 0xf0);
            local_430 = (long)local_ab4;
            local_770 = (long)local_acc;
            local_768 = &local_878;
            local_878[local_770] =
                 *(float *)(*local_418 + local_420 * 4) * *(float *)(*local_428 + local_430 * 4) +
                 (float)local_878[local_770];
            if (*(int *)(in_RDI + 0xd4) == 0) {
              local_588 = local_810;
              local_58c = local_acc;
              pfVar1 = (float *)(*local_810 +
                                (long)*(int *)((long)local_810 + 0x2c) * (long)local_acc *
                                local_810[2]);
              *pfVar1 = fVar7 + *pfVar1;
              local_598 = local_810;
              local_59c = local_acc;
              lVar2 = *local_810 +
                      (long)*(int *)((long)local_810 + 0x2c) * (long)local_acc * local_810[2];
              *(float *)(lVar2 + 4) = fVar8 + *(float *)(lVar2 + 4);
            }
            if (*(int *)(in_RDI + 0xd4) == 1) {
              local_780 = (long)local_acc;
              local_778 = local_810;
              pfVar1 = (float *)(*local_810 + local_780 * 4);
              *pfVar1 = fVar7 + *pfVar1;
            }
            if (*(int *)(in_RDI + 0xd4) == 2) {
              local_790 = (long)local_acc;
              local_788 = local_810;
              pfVar1 = (float *)(*local_810 + local_790 * 4);
              *pfVar1 = fVar8 + *pfVar1;
            }
          }
        }
        local_450 = &local_8d8;
        local_1d8 = local_450;
        if (local_8d0 != (int *)0x0) {
          local_1dc = 0xffffffff;
          LOCK();
          local_1e0 = *local_8d0;
          *local_8d0 = *local_8d0 + -1;
          UNLOCK();
          if (local_1e0 == 1) {
            if (local_8b8 == (long *)0x0) {
              local_20 = local_8d8;
              if (local_8d8 != (void *)0x0) {
                free(local_8d8);
              }
            }
            else {
              (**(code **)(*local_8b8 + 0x18))(local_8b8,local_8d8);
            }
          }
        }
        local_8d8 = (void *)0x0;
        local_8c8 = 0;
        local_8c0 = 0;
        local_8b0 = 0;
        local_8ac = 0;
        local_8a8 = 0;
        local_8a4 = 0;
        local_8a0 = 0;
        local_898 = 0;
        local_8d0 = (int *)0x0;
      }
      if (*(int *)(in_RDI + 0xd4) == 0) {
        for (local_ad0 = 0; local_ad0 < local_828; local_ad0 = local_ad0 + 1) {
          local_7a0 = (long)local_ad0;
          local_798 = &local_878;
          if (((float)local_878[local_7a0] != 0.0) || (NAN((float)local_878[local_7a0]))) {
            local_7b0 = (long)local_ad0;
            local_7a8 = &local_878;
            local_5a8 = local_810;
            local_5ac = local_ad0;
            pfVar1 = (float *)(*local_810 +
                              (long)*(int *)((long)local_810 + 0x2c) * (long)local_ad0 *
                              local_810[2]);
            *pfVar1 = *pfVar1 / (float)local_878[local_7b0];
            local_7c0 = (long)local_ad0;
            local_7b8 = &local_878;
            local_5b8 = local_810;
            local_5bc = local_ad0;
            lVar2 = *local_810 +
                    (long)*(int *)((long)local_810 + 0x2c) * (long)local_ad0 * local_810[2];
            *(float *)(lVar2 + 4) = *(float *)(lVar2 + 4) / (float)local_878[local_7c0];
          }
        }
      }
      else {
        for (local_ad4 = 0; local_ad4 < local_828; local_ad4 = local_ad4 + 1) {
          local_7d0 = (long)local_ad4;
          local_7c8 = &local_878;
          if (((float)local_878[local_7d0] != 0.0) || (NAN((float)local_878[local_7d0]))) {
            local_7e0 = (long)local_ad4;
            local_7d8 = &local_878;
            local_7f0 = (long)local_ad4;
            local_7e8 = local_810;
            pfVar1 = (float *)(*local_810 + local_7f0 * 4);
            *pfVar1 = *pfVar1 / (float)local_878[local_7e0];
          }
        }
      }
      local_7f4 = 0;
    }
    else {
      local_7f4 = -100;
    }
    local_888 = 1;
    local_440 = &local_878;
    if (local_870 != (int *)0x0) {
      local_1fc = 0xffffffff;
      LOCK();
      local_200 = *local_870;
      *local_870 = *local_870 + -1;
      UNLOCK();
      if (local_200 == 1) {
        local_1f8 = local_440;
        if (local_858 == (long *)0x0) {
          local_10 = local_878;
          if (local_878 != (undefined4 *)0x0) {
            free(local_878);
          }
        }
        else {
          (**(code **)(*local_858 + 0x18))(local_858,local_878);
        }
      }
    }
  }
  return local_7f4;
}

Assistant:

int InverseSpectrogram::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // https://github.com/librosa/librosa/blob/main/librosa/core/spectrum.py#L630

    // TODO custom window
    // TODO output length

    const int frames = bottom_blob.h;
    const int freqs = bottom_blob.c;
    // assert freqs == n_fft or freqs == n_fft / 2 + 1

    const int onesided = freqs == n_fft / 2 + 1 ? 1 : 0;

    const int outsize = center ? (frames - 1) * hoplen + (n_fft - n_fft / 2 * 2) : (frames - 1) * hoplen + n_fft;

    const size_t elemsize = bottom_blob.elemsize;

    if (returns == 0)
    {
        top_blob.create(2, outsize, elemsize, opt.blob_allocator);
    }
    else
    {
        top_blob.create(outsize, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    Mat window_sumsquare(outsize + n_fft, elemsize, opt.workspace_allocator);
    if (window_sumsquare.empty())
        return -100;

    top_blob.fill(0.f);
    window_sumsquare.fill(0.f);

    for (int j = 0; j < frames; j++)
    {
        // collect complex
        Mat sp(2, n_fft);
        if (onesided == 1)
        {
            for (int k = 0; k < n_fft / 2 + 1; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(k).row(j)[0];
                sp.row(k)[1] = bottom_blob.channel(k).row(j)[1];
            }
            for (int k = n_fft / 2 + 1; k < n_fft; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(n_fft - k).row(j)[0];
                sp.row(k)[1] = -bottom_blob.channel(n_fft - k).row(j)[1];
            }
        }
        else
        {
            for (int k = 0; k < n_fft; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(k).row(j)[0];
                sp.row(k)[1] = bottom_blob.channel(k).row(j)[1];
            }
        }

        if (normalized == 1)
        {
            float norm = sqrt(n_fft);
            for (int i = 0; i < 2 * n_fft; i++)
            {
                sp[i] *= norm;
            }
        }
        if (normalized == 2)
        {
            float norm = window_data[n_fft];
            for (int i = 0; i < 2 * n_fft; i++)
            {
                sp[i] *= norm;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < n_fft; i++)
        {
            // inverse dft
            float re = 0.f;
            float im = 0.f;
            for (int k = 0; k < n_fft; k++)
            {
                double angle = 2 * 3.14159265358979323846 * i * k / n_fft;

                re += sp.row(k)[0] * cosf(angle) - sp.row(k)[1] * sinf(angle);
                im += sp.row(k)[0] * sinf(angle) + sp.row(k)[1] * cosf(angle);
            }

            re /= n_fft;
            im /= n_fft;

            // apply window
            re *= window_data[i];
            im *= window_data[i];

            int output_index = j * hoplen + i;
            if (center == 1)
            {
                output_index -= n_fft / 2;
            }
            if (output_index >= 0 && output_index < outsize)
            {
                // square window
                window_sumsquare[output_index] += window_data[i] * window_data[i];

                if (returns == 0)
                {
                    top_blob.row(output_index)[0] += re;
                    top_blob.row(output_index)[1] += im;
                }
                if (returns == 1)
                {
                    top_blob[output_index] += re;
                }
                if (returns == 2)
                {
                    top_blob[output_index] += im;
                }
            }
        }
    }

    // square window norm
    if (returns == 0)
    {
        for (int i = 0; i < outsize; i++)
        {
            if (window_sumsquare[i] != 0.f)
            {
                top_blob.row(i)[0] /= window_sumsquare[i];
                top_blob.row(i)[1] /= window_sumsquare[i];
            }
        }
    }
    else
    {
        for (int i = 0; i < outsize; i++)
        {
            if (window_sumsquare[i] != 0.f)
                top_blob[i] /= window_sumsquare[i];
        }
    }

    return 0;
}